

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_make_huffman_table(huffman *hf)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint16_t *puVar3;
  uchar *puVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  byte bVar8;
  wchar_t local_f8;
  wchar_t cnt;
  wchar_t len;
  uint16_t *p;
  wchar_t ebits;
  wchar_t len_avail;
  wchar_t w;
  wchar_t tbl_size;
  wchar_t ptn;
  wchar_t maxbits;
  wchar_t i;
  wchar_t weight [17];
  wchar_t awStack_78 [2];
  wchar_t bitptn [17];
  uchar *bitlen;
  uint16_t *tbl;
  huffman *hf_local;
  
  tbl_size = L'\0';
  w = L'\0';
  ebits = L'耀';
  for (ptn = L'\x01'; ptn < L'\x11'; ptn = ptn + L'\x01') {
    awStack_78[ptn] = w;
    (&maxbits)[ptn] = ebits;
    if (hf->freq[ptn] != L'\0') {
      w = hf->freq[ptn] * ebits + w;
      tbl_size = ptn;
    }
    ebits = ebits >> 1;
  }
  if (((w & 0xffffU) == 0) && (tbl_size <= hf->tbl_bits)) {
    hf->max_bits = tbl_size;
    if (tbl_size < L'\x10') {
      bVar8 = 0x10 - (char)tbl_size;
      for (ptn = L'\x01'; ptn <= tbl_size; ptn = ptn + L'\x01') {
        awStack_78[ptn] = awStack_78[ptn] >> (bVar8 & 0x1f);
        (&maxbits)[ptn] = (&maxbits)[ptn] >> (bVar8 & 0x1f);
      }
    }
    wVar5 = 1 << ((byte)hf->tbl_bits & 0x1f);
    puVar3 = hf->tbl;
    puVar4 = hf->bitlen;
    wVar1 = hf->len_size;
    hf->tree_used = L'\0';
    for (ptn = L'\0'; ptn < wVar1; ptn = ptn + L'\x01') {
      if (puVar4[ptn] != '\0') {
        wVar6 = (wchar_t)puVar4[ptn];
        if (wVar5 < wVar6) {
          return L'\0';
        }
        wVar2 = awStack_78[wVar6];
        local_f8 = (&maxbits)[wVar6];
        wVar7 = wVar2 + local_f8;
        awStack_78[wVar6] = wVar7;
        if (wVar5 < wVar7) {
          return L'\0';
        }
        while (local_f8 = local_f8 + L'\xffffffff', L'\xffffffff' < local_f8) {
          puVar3[(long)wVar2 + (long)local_f8] = (uint16_t)ptn;
        }
      }
    }
    hf_local._4_4_ = L'\x01';
  }
  else {
    hf_local._4_4_ = L'\0';
  }
  return hf_local._4_4_;
}

Assistant:

static int
lzx_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if ((ptn & 0xffff) != 0 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}

	/*
	 * Make the table.
	 */
	tbl_size = 1 << hf->tbl_bits;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_size;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		if (len > tbl_size)
			return (0);
		ptn = bitptn[len];
		cnt = weight[len];
		/* Calculate next bit pattern */
		if ((bitptn[len] = ptn + cnt) > tbl_size)
			return (0);/* Invalid */
		/* Update the table */
		p = &(tbl[ptn]);
		while (--cnt >= 0)
			p[cnt] = (uint16_t)i;
	}
	return (1);
}